

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O0

void __thiscall
MissingDependencyScannerTestCyclicMissingDep::Run
          (MissingDependencyScannerTestCyclicMissingDep *this)

{
  Test *pTVar1;
  bool bVar2;
  MissingDependencyScanner *pMVar3;
  size_type sVar4;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  MissingDependencyScannerTestCyclicMissingDep *local_10;
  MissingDependencyScannerTestCyclicMissingDep *this_local;
  
  local_10 = this;
  MissingDependencyScannerTest::CreateInitialState(&this->super_MissingDependencyScannerTest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"generated_header",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"compiled_object",&local_69);
  MissingDependencyScannerTest::RecordDepsLogDep
            (&this->super_MissingDependencyScannerTest,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"compiled_object",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"generated_header",&local_b9);
  MissingDependencyScannerTest::RecordDepsLogDep
            (&this->super_MissingDependencyScannerTest,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  MissingDependencyScannerTest::ProcessAllNodes(&this->super_MissingDependencyScannerTest);
  pTVar1 = g_current_test;
  pMVar3 = MissingDependencyScannerTest::scanner(&this->super_MissingDependencyScannerTest);
  bVar2 = MissingDependencyScanner::HadMissingDeps(pMVar3);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                     ,0x8e,"scanner().HadMissingDeps()");
  pTVar1 = g_current_test;
  if (bVar2) {
    pMVar3 = MissingDependencyScannerTest::scanner(&this->super_MissingDependencyScannerTest);
    sVar4 = std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::size
                      (&pMVar3->nodes_missing_deps_);
    bVar2 = testing::Test::Check
                      (pTVar1,sVar4 == 2,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                       ,0x8f,"2u == scanner().nodes_missing_deps_.size()");
    pTVar1 = g_current_test;
    if (bVar2) {
      pMVar3 = MissingDependencyScannerTest::scanner(&this->super_MissingDependencyScannerTest);
      bVar2 = testing::Test::Check
                        (pTVar1,pMVar3->missing_dep_path_count_ == 2,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                         ,0x90,"2u == scanner().missing_dep_path_count_");
      if (bVar2) {
        MissingDependencyScannerTest::AssertMissingDependencyBetween
                  (&this->super_MissingDependencyScannerTest,"compiled_object","generated_header",
                   &(this->super_MissingDependencyScannerTest).generator_rule_);
        MissingDependencyScannerTest::AssertMissingDependencyBetween
                  (&this->super_MissingDependencyScannerTest,"generated_header","compiled_object",
                   &(this->super_MissingDependencyScannerTest).compile_rule_);
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(MissingDependencyScannerTest, CyclicMissingDep) {
  CreateInitialState();
  RecordDepsLogDep("generated_header", "compiled_object");
  RecordDepsLogDep("compiled_object", "generated_header");
  // In case of a cycle, both paths are reported (and there is
  // no way to fix the issue by adding deps).
  ProcessAllNodes();
  ASSERT_TRUE(scanner().HadMissingDeps());
  ASSERT_EQ(2u, scanner().nodes_missing_deps_.size());
  ASSERT_EQ(2u, scanner().missing_dep_path_count_);
  AssertMissingDependencyBetween("compiled_object", "generated_header",
                                 &generator_rule_);
  AssertMissingDependencyBetween("generated_header", "compiled_object",
                                 &compile_rule_);
}